

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  
  iVar1 = test();
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Success",7);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  return iVar1;
}

Assistant:

int main()
{
  int failure =
#if MOCKARON_DISABLE_HOOKS
    testnohook();
#else
    test();
#endif

  if (!failure)
    std::cerr << "Success" << std::endl;

  return failure;
}